

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O2

int ASN1_BIT_STRING_num_bytes(ASN1_BIT_STRING *str,size_t *out)

{
  int iVar1;
  undefined8 in_RAX;
  uint8_t padding_bits;
  
  padding_bits = (uint8_t)((ulong)in_RAX >> 0x38);
  iVar1 = asn1_bit_string_length(str,&padding_bits);
  if (padding_bits == '\0') {
    *out = (long)iVar1;
  }
  return (uint)(padding_bits == '\0');
}

Assistant:

int ASN1_BIT_STRING_num_bytes(const ASN1_BIT_STRING *str, size_t *out) {
  uint8_t padding_bits;
  int len = asn1_bit_string_length(str, &padding_bits);
  if (padding_bits != 0) {
    return 0;
  }
  *out = len;
  return 1;
}